

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Pack.h
# Opt level: O2

axl_va_list * __thiscall
axl::sl::PackPtrSize::operator()
          (axl_va_list *__return_storage_ptr__,PackPtrSize *this,void *p,size_t *size,
          axl_va_list *va)

{
  undefined8 uVar1;
  void *src;
  unsigned_long __n;
  
  src = axl_va_list::arg<void*>(va);
  __n = axl_va_list::arg<unsigned_long>(va);
  *size = __n;
  if (p != (void *)0x0) {
    if (src == (void *)0x0) {
      memset(p,0,__n);
    }
    else {
      __wrap_memcpy(p,src,__n);
    }
  }
  __return_storage_ptr__->m_isInitialized = false;
  uVar1 = *(undefined8 *)&va->field_0x8;
  *(undefined8 *)__return_storage_ptr__ = *(undefined8 *)va;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = uVar1;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = *(undefined8 *)&va->field_0x10;
  __return_storage_ptr__->m_isInitialized = true;
  return __return_storage_ptr__;
}

Assistant:

axl_va_list
	operator () (
		void* p,
		size_t* size,
		axl_va_list va
	) {
		void* obj = va.arg<void*> ();
		size_t objSize = va.arg<size_t> ();

		*size = objSize;

		if (p) {
			if (obj)
				memcpy(p, obj, objSize);
			else
				memset(p, 0, objSize);
		}

		return va;
	}